

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void av1_write_obu_tg_tile_headers
               (AV1_COMP *cpi,MACROBLOCKD *xd,PackBSParams *pack_bs_params,int tile_idx)

{
  OBU_TYPE obu_type_00;
  int iVar1;
  uint32_t uVar2;
  long *plVar3;
  uint32_t *puVar4;
  long lVar5;
  int in_ECX;
  long in_RDX;
  long *in_RDI;
  OBU_TYPE obu_type;
  int tg_size;
  int *curr_tg_hdr_size;
  CommonTileParams *tiles;
  AV1_COMMON *cm;
  int in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  aom_write_bit_buffer *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined3 in_stack_ffffffffffffffc0;
  undefined4 uVar6;
  
  plVar3 = in_RDI + 0x8404;
  puVar4 = (uint32_t *)(in_RDX + 0x40);
  iVar1 = (*(int *)((long)in_RDI + 0x42024) * (int)*plVar3 + *(int *)((long)in_RDI + 0x9d4c4) + -1)
          / *(int *)((long)in_RDI + 0x9d4c4);
  obu_type_00 = OBU_TILE_GROUP;
  if (*(int *)((long)in_RDI + 0x9d4c4) == 1) {
    obu_type_00 = OBU_FRAME;
  }
  uVar6 = CONCAT13(obu_type_00,in_stack_ffffffffffffffc0);
  uVar2 = av1_write_obu_header
                    ((AV1LevelParams *)(*in_RDI + 0x5a90),(int *)(in_RDI + 0x13a60),obu_type_00,
                     (_Bool)(*(byte *)(in_RDI[0x8401] + 0xf4) & 1),true,
                     (uint)*(byte *)(in_RDX + 0x38),*(uint8_t **)(in_RDX + 0x28));
  *puVar4 = uVar2;
  *(uint32_t *)(in_RDX + 0x3c) = *puVar4;
  if (*(int *)((long)in_RDI + 0x9d4c4) == 1) {
    uVar2 = write_frame_header_obu
                      ((AV1_COMP *)CONCAT44(iVar1,uVar6),
                       (MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       in_stack_ffffffffffffffb0,
                       (uint8_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                       in_stack_ffffffffffffffa4);
    *puVar4 = uVar2 + *puVar4;
  }
  lVar5 = *(long *)(in_RDX + 0x28) + (long)(int)*puVar4;
  if (in_ECX + iVar1 + -1 < (int)*plVar3 * *(int *)((long)in_RDI + 0x42024) + -1) {
    iVar1 = in_ECX + iVar1;
  }
  else {
    iVar1 = (int)*plVar3 * *(int *)((long)in_RDI + 0x42024);
  }
  uVar2 = write_tile_group_header
                    ((uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffb8),
                     (int)((ulong)lVar5 >> 0x20),(int)lVar5,iVar1 + -1,in_stack_ffffffffffffffa8);
  *puVar4 = uVar2 + *puVar4;
  **(int **)(in_RDX + 0x18) = *puVar4 + **(int **)(in_RDX + 0x18);
  return;
}

Assistant:

void av1_write_obu_tg_tile_headers(AV1_COMP *const cpi, MACROBLOCKD *const xd,
                                   PackBSParams *const pack_bs_params,
                                   const int tile_idx) {
  AV1_COMMON *const cm = &cpi->common;
  const CommonTileParams *const tiles = &cm->tiles;
  int *const curr_tg_hdr_size = &pack_bs_params->curr_tg_hdr_size;
  const int tg_size =
      (tiles->rows * tiles->cols + cpi->num_tg - 1) / cpi->num_tg;

  // Write Tile group, frame and OBU header
  // A new tile group begins at this tile.  Write the obu header and
  // tile group header
  const OBU_TYPE obu_type = (cpi->num_tg == 1) ? OBU_FRAME : OBU_TILE_GROUP;
  *curr_tg_hdr_size = av1_write_obu_header(
      &cpi->ppi->level_params, &cpi->frame_header_count, obu_type,
      cm->seq_params->has_nonzero_operating_point_idc,
      /*is_layer_specific_obu=*/true, pack_bs_params->obu_extn_header,
      pack_bs_params->tile_data_curr);
  pack_bs_params->obu_header_size = *curr_tg_hdr_size;

  if (cpi->num_tg == 1)
    *curr_tg_hdr_size += write_frame_header_obu(
        cpi, xd, pack_bs_params->saved_wb,
        pack_bs_params->tile_data_curr + *curr_tg_hdr_size, 0);
  *curr_tg_hdr_size += write_tile_group_header(
      pack_bs_params->tile_data_curr + *curr_tg_hdr_size, tile_idx,
      AOMMIN(tile_idx + tg_size - 1, tiles->cols * tiles->rows - 1),
      (tiles->log2_rows + tiles->log2_cols), cpi->num_tg > 1);
  *pack_bs_params->total_size += *curr_tg_hdr_size;
}